

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ast::ConditionalExpression::evalImpl(ConditionalExpression *this,EvalContext *context)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  SVInt *this_00;
  Expression *lhs;
  Expression *rhs;
  size_type sVar6;
  size_type sVar7;
  EvalContext *context_00;
  ConditionalExpression *in_RSI;
  ConstantValue *in_RDI;
  SVQueue result_1;
  SVQueue *ra_1;
  SVQueue *la_1;
  vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> result;
  span<const_slang::ConstantValue,_18446744073709551615UL> ra;
  span<const_slang::ConstantValue,_18446744073709551615UL> la;
  anon_class_8_1_8991fb9c combineArrays;
  ConstantValue cvr;
  ConstantValue cvl;
  Condition *cond;
  iterator __end2;
  iterator __begin2;
  span<const_slang::ast::ConditionalExpression::Condition,_18446744073709551615UL> *__range2;
  ConstantValue cp;
  Type *in_stack_fffffffffffffce8;
  EvalContext *in_stack_fffffffffffffcf0;
  undefined7 in_stack_fffffffffffffcf8;
  undefined1 in_stack_fffffffffffffcff;
  EvalContext *in_stack_fffffffffffffd00;
  Pattern *in_stack_fffffffffffffd08;
  vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *in_stack_fffffffffffffd10;
  SVQueue *in_stack_fffffffffffffda0;
  SVQueue *in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdb0;
  undefined1 in_stack_fffffffffffffdb4;
  undefined7 in_stack_fffffffffffffdc8;
  allocator<slang::ConstantValue> local_1f9 [89];
  SVQueue *local_1a0;
  SVQueue *local_198;
  allocator<slang::ConstantValue> local_189 [25];
  span<slang::ConstantValue,_18446744073709551615UL> local_170;
  span<slang::ConstantValue,_18446744073709551615UL> local_150;
  undefined4 local_c4;
  reference local_60;
  Condition *local_58;
  __normal_iterator<const_slang::ast::ConditionalExpression::Condition_*,_std::span<const_slang::ast::ConditionalExpression::Condition,_18446744073709551615UL>_>
  local_50;
  span<const_slang::ast::ConditionalExpression::Condition,_18446744073709551615UL> *local_48;
  
  slang::ConstantValue::ConstantValue((ConstantValue *)0x9b943f);
  local_48 = &in_RSI->conditions;
  local_50._M_current =
       (Condition *)
       std::span<const_slang::ast::ConditionalExpression::Condition,_18446744073709551615UL>::begin
                 ((span<const_slang::ast::ConditionalExpression::Condition,_18446744073709551615UL>
                   *)in_stack_fffffffffffffce8);
  local_58 = (Condition *)
             std::span<const_slang::ast::ConditionalExpression::Condition,_18446744073709551615UL>::
             end((span<const_slang::ast::ConditionalExpression::Condition,_18446744073709551615UL> *
                 )CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8));
  while (bVar1 = __gnu_cxx::
                 operator==<const_slang::ast::ConditionalExpression::Condition_*,_std::span<const_slang::ast::ConditionalExpression::Condition,_18446744073709551615UL>_>
                           ((__normal_iterator<const_slang::ast::ConditionalExpression::Condition_*,_std::span<const_slang::ast::ConditionalExpression::Condition,_18446744073709551615UL>_>
                             *)in_stack_fffffffffffffcf0,
                            (__normal_iterator<const_slang::ast::ConditionalExpression::Condition_*,_std::span<const_slang::ast::ConditionalExpression::Condition,_18446744073709551615UL>_>
                             *)in_stack_fffffffffffffce8), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_60 = __gnu_cxx::
               __normal_iterator<const_slang::ast::ConditionalExpression::Condition_*,_std::span<const_slang::ast::ConditionalExpression::Condition,_18446744073709551615UL>_>
               ::operator*(&local_50);
    not_null<const_slang::ast::Expression_*>::operator->
              ((not_null<const_slang::ast::Expression_*> *)0x9b94bf);
    Expression::eval((Expression *)CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8),
                     in_stack_fffffffffffffcf0);
    slang::ConstantValue::operator=
              ((ConstantValue *)in_stack_fffffffffffffcf0,(ConstantValue *)in_stack_fffffffffffffce8
              );
    slang::ConstantValue::~ConstantValue((ConstantValue *)0x9b950a);
    if (local_60->pattern != (Pattern *)0x0) {
      Pattern::eval(in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
                    (ConstantValue *)CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8),
                    (CaseStatementCondition)((ulong)in_stack_fffffffffffffcf0 >> 0x20));
      slang::ConstantValue::operator=
                ((ConstantValue *)in_stack_fffffffffffffcf0,
                 (ConstantValue *)in_stack_fffffffffffffce8);
      slang::ConstantValue::~ConstantValue((ConstantValue *)0x9b9569);
    }
    bVar1 = slang::ConstantValue::bad((ConstantValue *)0x9b9591);
    if (bVar1) {
      slang::ConstantValue::ConstantValue
                ((ConstantValue *)in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
      local_c4 = 1;
      goto LAB_009b9d4b;
    }
    bVar1 = slang::ConstantValue::isTrue((ConstantValue *)in_stack_fffffffffffffcf0);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_slang::ast::ConditionalExpression::Condition_*,_std::span<const_slang::ast::ConditionalExpression::Condition,_18446744073709551615UL>_>
    ::operator++(&local_50);
  }
  bVar1 = slang::ConstantValue::isInteger((ConstantValue *)0x9b9610);
  if (bVar1) {
    this_00 = slang::ConstantValue::integer((ConstantValue *)0x9b9636);
    uVar5 = SVInt::hasUnknown(this_00);
    if ((bool)uVar5) {
      lhs = left(in_RSI);
      Expression::eval((Expression *)CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8),
                       in_stack_fffffffffffffcf0);
      rhs = right(in_RSI);
      Expression::eval((Expression *)CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8),
                       in_stack_fffffffffffffcf0);
      uVar2 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0x9b96df);
      if (((bool)uVar2) &&
         (uVar3 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0x9b9702),
         (bool)uVar3)) {
        uVar4 = slang::ConstantValue::isInteger((ConstantValue *)0x9b977a);
        if (((bool)uVar4) &&
           (in_stack_fffffffffffffdb4 = slang::ConstantValue::isInteger((ConstantValue *)0x9b97a0),
           (bool)in_stack_fffffffffffffdb4)) {
          slang::ConstantValue::integer((ConstantValue *)0x9b97c6);
          slang::ConstantValue::integer((ConstantValue *)0x9b97dd);
          slang::ConstantValue::integer((ConstantValue *)0x9b97f4);
          SVInt::conditional((SVInt *)CONCAT17(uVar5,in_stack_fffffffffffffdc8),(SVInt *)lhs,
                             (SVInt *)rhs);
          slang::ConstantValue::ConstantValue
                    ((ConstantValue *)in_stack_fffffffffffffcf0,(SVInt *)in_stack_fffffffffffffce8);
          SVInt::~SVInt((SVInt *)in_stack_fffffffffffffd00);
          local_c4 = 1;
        }
        else {
          bVar1 = slang::ConstantValue::isUnpacked((ConstantValue *)0x9b989c);
          if (bVar1) {
            local_150 = slang::ConstantValue::elements((ConstantValue *)0x9b98c2);
            std::span<const_slang::ConstantValue,_18446744073709551615UL>::
            span<slang::ConstantValue,_18446744073709551615UL>
                      ((span<const_slang::ConstantValue,_18446744073709551615UL> *)
                       in_stack_fffffffffffffd00,
                       (span<slang::ConstantValue,_18446744073709551615UL> *)
                       CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8));
            local_170 = slang::ConstantValue::elements((ConstantValue *)0x9b9916);
            std::span<const_slang::ConstantValue,_18446744073709551615UL>::
            span<slang::ConstantValue,_18446744073709551615UL>
                      ((span<const_slang::ConstantValue,_18446744073709551615UL> *)
                       in_stack_fffffffffffffd00,
                       (span<slang::ConstantValue,_18446744073709551615UL> *)
                       CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8));
            sVar6 = std::span<const_slang::ConstantValue,_18446744073709551615UL>::size
                              ((span<const_slang::ConstantValue,_18446744073709551615UL> *)0x9b996a)
            ;
            sVar7 = std::span<const_slang::ConstantValue,_18446744073709551615UL>::size
                              ((span<const_slang::ConstantValue,_18446744073709551615UL> *)0x9b997f)
            ;
            if (sVar6 == sVar7) {
              not_null<const_slang::ast::Type_*>::operator->
                        ((not_null<const_slang::ast::Type_*> *)0x9b99a4);
              bVar1 = Type::isArray(in_stack_fffffffffffffce8);
              if (bVar1) {
                std::span<const_slang::ConstantValue,_18446744073709551615UL>::size
                          ((span<const_slang::ConstantValue,_18446744073709551615UL> *)0x9b99d5);
                std::allocator<slang::ConstantValue>::allocator
                          ((allocator<slang::ConstantValue> *)0x9b99ec);
                std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::vector
                          (in_stack_fffffffffffffd10,(size_type)in_stack_fffffffffffffd08,
                           (allocator_type *)in_stack_fffffffffffffd00);
                std::allocator<slang::ConstantValue>::~allocator(local_189);
                const::$_0::operator()
                          ((anon_class_8_1_8991fb9c *)rhs,
                           (vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)
                           CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(
                                                  in_stack_fffffffffffffdb4,
                                                  in_stack_fffffffffffffdb0)))),
                           (span<const_slang::ConstantValue,_18446744073709551615UL> *)
                           in_stack_fffffffffffffda8,
                           (span<const_slang::ConstantValue,_18446744073709551615UL> *)
                           in_stack_fffffffffffffda0);
                local_c4 = 1;
                std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::~vector
                          ((vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)
                           in_stack_fffffffffffffd00);
                goto LAB_009b9c7a;
              }
            }
          }
          else {
            bVar1 = slang::ConstantValue::isQueue((ConstantValue *)0x9b9abc);
            if (bVar1) {
              slang::ConstantValue::queue((ConstantValue *)0x9b9adc);
              local_198 = CopyPtr<slang::SVQueue>::operator*((CopyPtr<slang::SVQueue> *)0x9b9aed);
              slang::ConstantValue::queue((ConstantValue *)0x9b9b0e);
              local_1a0 = CopyPtr<slang::SVQueue>::operator*((CopyPtr<slang::SVQueue> *)0x9b9b1f);
              sVar6 = std::deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::size
                                ((deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                                  *)0x9b9b40);
              sVar7 = std::deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::size
                                ((deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                                  *)0x9b9b52);
              if (sVar6 == sVar7) {
                std::deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::size
                          ((deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)
                           0x9b9b70);
                std::allocator<slang::ConstantValue>::allocator
                          ((allocator<slang::ConstantValue> *)0x9b9b87);
                SVQueue::deque((SVQueue *)in_stack_fffffffffffffd00,
                               CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8),
                               (allocator_type *)in_stack_fffffffffffffcf0);
                std::allocator<slang::ConstantValue>::~allocator(local_1f9);
                const::$_0::operator()
                          ((anon_class_8_1_8991fb9c *)rhs,
                           (SVQueue *)
                           CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(
                                                  in_stack_fffffffffffffdb4,
                                                  in_stack_fffffffffffffdb0)))),
                           in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
                local_c4 = 1;
                SVQueue::~SVQueue((SVQueue *)0x9b9bf4);
                goto LAB_009b9c7a;
              }
            }
          }
          not_null<const_slang::ast::Type_*>::operator->
                    ((not_null<const_slang::ast::Type_*> *)0x9b9c54);
          Type::getDefaultValue
                    ((Type *)CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8));
          local_c4 = 1;
        }
      }
      else {
        slang::ConstantValue::ConstantValue
                  ((ConstantValue *)in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
        local_c4 = 1;
      }
LAB_009b9c7a:
      slang::ConstantValue::~ConstantValue((ConstantValue *)0x9b9c87);
      slang::ConstantValue::~ConstantValue((ConstantValue *)0x9b9c94);
      goto LAB_009b9d4b;
    }
  }
  uVar5 = slang::ConstantValue::isTrue((ConstantValue *)in_stack_fffffffffffffcf0);
  if ((bool)uVar5) {
    context_00 = (EvalContext *)left(in_RSI);
    Expression::eval((Expression *)CONCAT17(uVar5,in_stack_fffffffffffffcf8),context_00);
    local_c4 = 1;
  }
  else {
    right(in_RSI);
    Expression::eval((Expression *)CONCAT17(uVar5,in_stack_fffffffffffffcf8),
                     in_stack_fffffffffffffcf0);
    local_c4 = 1;
  }
LAB_009b9d4b:
  slang::ConstantValue::~ConstantValue((ConstantValue *)0x9b9d58);
  return in_RDI;
}

Assistant:

ConstantValue ConditionalExpression::evalImpl(EvalContext& context) const {
    ConstantValue cp;
    for (auto& cond : conditions) {
        cp = cond.expr->eval(context);
        if (cond.pattern)
            cp = cond.pattern->eval(context, cp, CaseStatementCondition::Normal);

        if (cp.bad())
            return nullptr;

        if (!cp.isTrue())
            break;
    }

    // When the conditional predicate is unknown, there are rules to combine both sides
    // and return the hybrid result.
    if (cp.isInteger() && cp.integer().hasUnknown()) {
        ConstantValue cvl = left().eval(context);
        ConstantValue cvr = right().eval(context);
        if (!cvl || !cvr)
            return nullptr;

        if (cvl.isInteger() && cvr.isInteger())
            return SVInt::conditional(cp.integer(), cvl.integer(), cvr.integer());

        auto combineArrays = [&](auto& result, auto& la, auto& ra) -> ConstantValue {
            ConstantValue defaultElement = type->getArrayElementType()->getDefaultValue();

            // [11.4.11] says that if both sides are unpacked arrays, we
            // check each element. If they are equal, take it in the result,
            // otherwise use the default.
            for (size_t i = 0; i < la.size(); i++) {
                ConstantValue comp = OpInfo::eval(BinaryOperator::Equality, la[i], ra[i]);
                if (!comp)
                    return nullptr;

                logic_t l = (logic_t)comp.integer();
                if (l.isUnknown() || !l)
                    result[i] = defaultElement;
                else
                    result[i] = la[i];
            }

            return result;
        };

        if (cvl.isUnpacked()) {
            // Sizes here might differ for dynamic arrays.
            std::span<const ConstantValue> la = cvl.elements();
            std::span<const ConstantValue> ra = cvr.elements();
            if (la.size() == ra.size() && type->isArray()) {
                std::vector<ConstantValue> result(la.size());
                return combineArrays(result, la, ra);
            }
        }
        else if (cvl.isQueue()) {
            auto& la = *cvl.queue();
            auto& ra = *cvr.queue();
            if (la.size() == ra.size()) {
                SVQueue result(la.size());
                return combineArrays(result, la, ra);
            }
        }

        return type->getDefaultValue();
    }

    if (cp.isTrue())
        return left().eval(context);
    else
        return right().eval(context);
}